

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5UnicodeIsAlnum(Unicode61Tokenizer *p,int iCode)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  
  uVar1 = sqlite3Fts5UnicodeCategory(iCode);
  if (0 < p->nException) {
    iVar2 = p->nException + -1;
    iVar4 = 0;
    do {
      uVar3 = (uint)(iVar4 + iVar2) >> 1;
      if (p->aiException[uVar3] == iCode) {
        uVar3 = 1;
        goto LAB_001b14c3;
      }
      if (p->aiException[uVar3] < iCode) {
        iVar4 = uVar3 + 1;
      }
      else {
        iVar2 = uVar3 - 1;
      }
    } while (iVar4 <= iVar2);
  }
  uVar3 = 0;
LAB_001b14c3:
  return uVar3 ^ p->aCategory[uVar1];
}

Assistant:

static int fts5UnicodeIsAlnum(Unicode61Tokenizer *p, int iCode){
  return (
    p->aCategory[sqlite3Fts5UnicodeCategory((u32)iCode)]
    ^ fts5UnicodeIsException(p, iCode)
  );
}